

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# netbase.h
# Opt level: O2

void __thiscall Proxy::Proxy(Proxy *this,string path,bool _randomize_credentials)

{
  long lVar1;
  bool in_DL;
  undefined7 in_register_00000031;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  CService::CService(&this->proxy);
  std::__cxx11::string::string
            ((string *)&this->m_unix_socket_path,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT71(in_register_00000031,_randomize_credentials));
  this->m_is_unix_socket = true;
  this->m_randomize_credentials = in_DL;
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

explicit Proxy(const std::string path, bool _randomize_credentials = false) : m_unix_socket_path(path), m_is_unix_socket(true), m_randomize_credentials(_randomize_credentials) {}